

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O2

void cfd::core::Amount::CheckValidAmount(int64_t satoshi_amount)

{
  CfdException *this;
  allocator local_41;
  int64_t satoshi_amount_local;
  undefined1 local_38 [32];
  
  if ((ulong)satoshi_amount < 0x775f05a074001) {
    return;
  }
  local_38._0_8_ = "cfdcore_amount.cpp";
  local_38._8_4_ = 0x33;
  local_38._16_8_ = "CheckValidAmount";
  satoshi_amount_local = satoshi_amount;
  logger::warn<long&>((CfdSourceLocation *)local_38,"Amount out of range. amount={}.",
                      &satoshi_amount_local);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Amount out of range.",&local_41);
  CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Amount::CheckValidAmount(int64_t satoshi_amount) {
  if (!IsValidAmount(satoshi_amount)) {
    warn(CFD_LOG_SOURCE, "Amount out of range. amount={}.", satoshi_amount);
    throw CfdException(kCfdOutOfRangeError, "Amount out of range.");
  }
}